

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::detail::fixed_dynamic_array<unsigned_int,_512U,_std::allocator<unsigned_int>_>::
fixed_dynamic_array(fixed_dynamic_array<unsigned_int,_512U,_std::allocator<unsigned_int>_> *this,
                   size_type size_in,value_type *value_in,allocator_type *alloc_in)

{
  value_type vVar1;
  pointer pvVar2;
  uint in_EAX;
  ulong uVar3;
  size_type sVar4;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
            (&this->
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>,
             0x200,(const_reference)((long)&uStack_28 + 4),alloc_in);
  (this->super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>).
  _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_00216050;
  sVar4 = 0x200;
  if (size_in < 0x200) {
    sVar4 = size_in;
  }
  pvVar2 = (this->super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
           ).elems;
  vVar1 = *value_in;
  for (uVar3 = 0; sVar4 << 2 != uVar3; uVar3 = uVar3 + 4) {
    *(value_type *)((long)pvVar2 + uVar3) = vVar1;
  }
  return;
}

Assistant:

explicit constexpr fixed_dynamic_array(const typename base_class_type::size_type       size_in  = MySize,
                                           const typename base_class_type::value_type&     value_in = typename base_class_type::value_type(),
                                           const typename base_class_type::allocator_type& alloc_in = typename base_class_type::allocator_type())
      : base_class_type(MySize, typename base_class_type::value_type(), alloc_in)
    {
      detail::fill_unsafe(base_class_type::begin(),
                          base_class_type::begin() + (detail::min_unsafe)(MySize, static_cast<typename base_class_type::size_type>(size_in)),
                          value_in);
    }